

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pick.cpp
# Opt level: O2

size_t __thiscall
polyscope::pick::localIndexToGlobal
          (pick *this,pair<polyscope::Structure_*,_unsigned_long> localPick)

{
  long *plVar1;
  runtime_error *this_00;
  size_t sVar2;
  
  plVar1 = structureRanges;
  if (this == (pick *)0x0) {
    sVar2 = 0;
  }
  else {
    while( true ) {
      if (plVar1 == DAT_00483a60) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10,localPick.first,localPick.second);
        std::runtime_error::runtime_error
                  (this_00,"structure does not match any allocated pick range");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((pick *)*plVar1 == this) break;
      plVar1 = plVar1 + 3;
    }
    sVar2 = (long)(((localPick.first)->objectTransform).value.value + -7) + plVar1[2];
  }
  return sVar2;
}

Assistant:

size_t localIndexToGlobal(std::pair<Structure*, size_t> localPick) {
  if (localPick.first == nullptr) return 0;

  for (const auto& x : structureRanges) {
    size_t rangeStart = std::get<0>(x);
    size_t rangeEnd = std::get<1>(x);
    Structure* structure = std::get<2>(x);

    if (structure == localPick.first) {
      return rangeStart + localPick.second;
    }
  }

  throw std::runtime_error("structure does not match any allocated pick range");
  return 0;
}